

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

void Gia_ManPrintMuxStats(Gia_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int level;
  Gia_Man_t *pGVar4;
  int iVar5;
  uint uVar6;
  double dVar7;
  uint local_30;
  uint local_2c;
  
  if (p->pMuxes == (uint *)0x0) {
    Gia_ManCountMuxXor(p,(int *)&local_2c,(int *)&local_30);
    pGVar4 = p;
    iVar5 = Gia_ManAndNotBufNum(p);
    level = (int)pGVar4;
    uVar3 = (local_30 + local_2c) * -3 + iVar5;
    uVar2 = local_30;
    uVar6 = local_2c;
  }
  else {
    pGVar4 = p;
    iVar1 = Gia_ManAndNotBufNum(p);
    level = (int)pGVar4;
    iVar5 = p->nXors + p->nMuxes;
    uVar3 = iVar1 - iVar5;
    iVar5 = iVar5 * 3 + uVar3;
    uVar2 = p->nXors;
    uVar6 = p->nMuxes;
  }
  Abc_Print(level,"stats:  ");
  dVar7 = (double)iVar5;
  Abc_Print(level,"xor =%8d %6.2f %%   ",((double)(int)uVar2 * 300.0) / dVar7,(ulong)uVar2);
  Abc_Print(level,"mux =%8d %6.2f %%   ",((double)(int)uVar6 * 300.0) / dVar7,(ulong)uVar6);
  Abc_Print(level,"and =%8d %6.2f %%   ",((double)(int)uVar3 * 100.0) / dVar7,(ulong)uVar3);
  uVar2 = Gia_ManAndNotBufNum(p);
  Abc_Print((int)p,"obj =%8d  ",(ulong)uVar2);
  fflush(_stdout);
  return;
}

Assistant:

void Gia_ManPrintMuxStats( Gia_Man_t * p )
{
    int nAnds, nMuxes, nXors, nTotal;
    if ( p->pMuxes )
    {
        nAnds  = Gia_ManAndNotBufNum(p)-Gia_ManXorNum(p)-Gia_ManMuxNum(p);
        nXors  = Gia_ManXorNum(p);
        nMuxes = Gia_ManMuxNum(p);
        nTotal = nAnds + 3*nXors + 3*nMuxes;
    }
    else 
    {
        Gia_ManCountMuxXor( p, &nMuxes, &nXors );
        nAnds  = Gia_ManAndNotBufNum(p) - 3*nMuxes - 3*nXors;
        nTotal = Gia_ManAndNotBufNum(p);
    }
    Abc_Print( 1, "stats:  " );
    Abc_Print( 1, "xor =%8d %6.2f %%   ", nXors,  300.0*nXors/nTotal );
    Abc_Print( 1, "mux =%8d %6.2f %%   ", nMuxes, 300.0*nMuxes/nTotal );
    Abc_Print( 1, "and =%8d %6.2f %%   ", nAnds,  100.0*nAnds/nTotal );
    Abc_Print( 1, "obj =%8d  ", Gia_ManAndNotBufNum(p) );
    fflush( stdout );
}